

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

bool __thiscall wirehair::Codec::AllocateMatrix(Codec *this)

{
  uint8_t *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  size_t in_RDI;
  uint8_t *matrix;
  uint64_t sizeBytes;
  uint heavy_bytes;
  uint heavy_pitch;
  uint heavy_cols;
  uint heavy_rows;
  uint pivot_words;
  uint pivot_count;
  uint compress_matrix_words;
  uint compress_rows;
  uint ge_matrix_words;
  uint ge_pitch;
  uint ge_rows;
  uint ge_cols;
  undefined4 in_stack_ffffffffffffffa0;
  uint uVar12;
  
  iVar2 = (uint)*(ushort *)(in_RDI + 0x8e) + (uint)*(ushort *)(in_RDI + 0x18);
  iVar3 = (uint)*(ushort *)(in_RDI + 0x8e) + (uint)*(ushort *)(in_RDI + 10) +
          (uint)*(ushort *)(in_RDI + 0x14) + 1;
  uVar4 = iVar2 + 0x3fU >> 6;
  uVar5 = iVar3 * uVar4;
  uVar6 = *(ushort *)(in_RDI + 4) * uVar4;
  uVar7 = iVar2 + (uint)*(ushort *)(in_RDI + 0x14);
  iVar8 = *(ushort *)(in_RDI + 0x14) + 6;
  if (*(ushort *)(in_RDI + 0x18) < 0x12) {
    uVar12 = (uint)*(ushort *)(in_RDI + 0x18);
  }
  else {
    uVar12 = 0x12;
  }
  uVar9 = uVar12 + 6 & 0xfffffffc;
  uVar10 = uVar9 * iVar8;
  uVar11 = (ulong)uVar6 * 8 + (ulong)uVar5 * 8 + (ulong)uVar10 + (ulong)(uVar7 * 2 + iVar2) * 2;
  if (*(ulong *)(in_RDI + 0xa0) < uVar11) {
    FreeMatrix((Codec *)CONCAT44(uVar12,in_stack_ffffffffffffffa0));
    puVar1 = SIMDSafeAllocate(in_RDI);
    if (puVar1 == (uint8_t *)0x0) {
      return false;
    }
    *(ulong *)(in_RDI + 0xa0) = uVar11;
    *(uint8_t **)(in_RDI + 0x90) = puVar1;
  }
  *(uint *)(in_RDI + 0xa8) = uVar4;
  *(int *)(in_RDI + 0xac) = iVar3;
  *(int *)(in_RDI + 0xb0) = iVar2;
  *(ulong *)(in_RDI + 0x98) = *(long *)(in_RDI + 0x90) + (ulong)uVar6 * 8;
  *(uint *)(in_RDI + 0xe8) = uVar9;
  *(int *)(in_RDI + 0xf0) = iVar8;
  *(uint *)(in_RDI + 0xec) = uVar12;
  *(uint *)(in_RDI + 0xf4) =
       ((uint)*(ushort *)(in_RDI + 0x8e) + (uint)*(ushort *)(in_RDI + 0x18)) - uVar12;
  *(ulong *)(in_RDI + 0xe0) = *(long *)(in_RDI + 0x98) + (ulong)uVar5 * 8;
  *(ulong *)(in_RDI + 0xb8) = *(long *)(in_RDI + 0xe0) + (ulong)uVar10;
  *(ulong *)(in_RDI + 0xd0) = *(long *)(in_RDI + 0xb8) + (ulong)uVar7 * 2;
  *(ulong *)(in_RDI + 200) = *(long *)(in_RDI + 0xd0) + (ulong)uVar7 * 2;
  memset(*(void **)(in_RDI + 0x90),0,(ulong)uVar6 << 3);
  memset(*(void **)(in_RDI + 0x98),0,(ulong)(iVar2 * uVar4) << 3);
  return true;
}

Assistant:

bool Codec::AllocateMatrix()
{
    CAT_IF_DUMP(cout << endl << "---- AllocateMatrix ----" << endl << endl;)

    // GE matrix
    const unsigned ge_cols = _defer_count + _mix_count;
    const unsigned ge_rows = _defer_count + _dense_count + _extra_count + 1; // One extra for workspace
    const unsigned ge_pitch = (ge_cols + 63) / 64;
    const unsigned ge_matrix_words = ge_rows * ge_pitch;

    // Compression matrix
    const unsigned compress_rows = _block_count;
    const unsigned compress_matrix_words = compress_rows * ge_pitch;

    // Pivots
    const unsigned pivot_count = ge_cols + _extra_count;
    const unsigned pivot_words = pivot_count * 2 + ge_cols;

    // Heavy
    const unsigned heavy_rows = kHeavyRows + _extra_count;
    const unsigned heavy_cols = _mix_count < kHeavyCols ? _mix_count : kHeavyCols;
    const unsigned heavy_pitch = (heavy_cols + 3 + 3) & ~3; // Round up columns+3 to next multiple of 4
    const unsigned heavy_bytes = heavy_pitch * heavy_rows;

    // Calculate buffer size
    const uint64_t sizeBytes = \
        compress_matrix_words * sizeof(uint64_t)
        + ge_matrix_words * sizeof(uint64_t)
        + heavy_bytes
        + pivot_words * sizeof(uint16_t);

    // If need to allocate more:
    if (_ge_allocated < sizeBytes)
    {
        FreeMatrix();

        uint8_t * GF256_RESTRICT matrix = SIMDSafeAllocate((size_t)sizeBytes);
        if (!matrix) {
            return false;
        }

        _ge_allocated = sizeBytes;
        _compress_matrix = reinterpret_cast<uint64_t *>( matrix );
    }

    // Store pointers
    _ge_pitch = ge_pitch;
    _ge_rows = ge_rows;
    _ge_cols = ge_cols;
    _ge_matrix = _compress_matrix + compress_matrix_words;
    _heavy_pitch = heavy_pitch;
    _heavy_rows = heavy_rows;
    _heavy_columns = heavy_cols;
    _first_heavy_column = _defer_count + _mix_count - heavy_cols;
    _heavy_matrix = reinterpret_cast<uint8_t *>( _ge_matrix + ge_matrix_words );
    _pivots = reinterpret_cast<uint16_t *>( _heavy_matrix + heavy_bytes );
    _ge_row_map = _pivots + pivot_count;
    _ge_col_map = _ge_row_map + pivot_count;

    CAT_IF_DUMP(cout << "GE matrix is " << ge_rows << " x " << ge_cols
        << " with pitch " << ge_pitch << " consuming "
        << ge_matrix_words * sizeof(uint64_t) << " bytes" << endl;)
    CAT_IF_DUMP(cout << "Compress matrix is " << compress_rows
        << " x " << ge_cols << " with pitch " << ge_pitch
        << " consuming " << compress_matrix_words * sizeof(uint64_t)
        << " bytes" << endl;)
    CAT_IF_DUMP(cout << "Allocated " << pivot_count
        << " pivots, consuming " << pivot_words*2 << " bytes" << endl;)
    CAT_IF_DUMP(cout << "Allocated " << kHeavyRows
        << " heavy rows, consuming " << heavy_bytes << " bytes" << endl;)

    // Clear entire Compression matrix
    memset(_compress_matrix, 0, compress_matrix_words * sizeof(uint64_t));

    // Clear entire GE matrix.
    // This clears ge_cols not ge_rows because we just need to clear the upper
    // square matrix, whereas ge_rows also includes some extra rows for data
    // received in excess of N for when the decoder fails and has to resume
    // again.
    // When these extra rows are added we clear the row memory at that point.
    memset(_ge_matrix, 0, ge_cols * ge_pitch * sizeof(uint64_t));

    return true;
}